

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeavyRowGenerator.cpp
# Opt level: O2

void __thiscall OffsetCauchyMatrixParams::FillMatrix(OffsetCauchyMatrixParams *this,uint8_t *matrix)

{
  uint i;
  long lVar1;
  uint8_t *puVar2;
  uint j;
  long lVar3;
  
  for (lVar1 = 0; lVar1 != 0x12; lVar1 = lVar1 + 1) {
    puVar2 = matrix;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *puVar2 = GF256Ctx.GF256_INV_TABLE
                [(this->RowWiggle + (int)lVar3 ^ this->ColWiggle + (int)lVar1 + this->Rows) & 0xff];
      puVar2 = puVar2 + 0x12;
    }
    matrix = matrix + 1;
  }
  return;
}

Assistant:

void FillMatrix(uint8_t* matrix)
    {
        for (unsigned i = 0; i < kColumns; ++i)
        {
            for (unsigned j = 0; j < kRows; ++j)
            {
                // Cauchy matrix elements:
                // C_ij = 1 / (X_i - Y_j)

                SIAMESE_DEBUG_ASSERT(ColWiggle + i + Rows < 256);
                const uint8_t X_i = (uint8_t)(ColWiggle + i + Rows);

                SIAMESE_DEBUG_ASSERT(RowWiggle + j < Rows);
                const uint8_t Y_j = (uint8_t)(RowWiggle + j);

                const uint8_t C_ij = gf256_inv(X_i ^ Y_j);

                matrix[j * kColumns + i] = C_ij;
            }
        }
    }